

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsTableBreakingLogic.cpp
# Opt level: O2

WidthVector * __thiscall
KDReports::TableBreakingLogic::widthPerPage
          (WidthVector *__return_storage_ptr__,TableBreakingLogic *this,QVector<int> *colPerPage)

{
  qsizetype size;
  const_reference piVar1;
  const_reference pdVar2;
  reference pdVar3;
  long lVar4;
  int page;
  long i_00;
  int i;
  long i_01;
  double local_38;
  
  size = (colPerPage->d).size;
  if (size <= this->m_pages) {
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (double *)0x0;
    (__return_storage_ptr__->d).size = 0;
    QList<double>::resize(__return_storage_ptr__,size);
    lVar4 = 0;
    for (i_00 = 0; i_00 < (colPerPage->d).size; i_00 = i_00 + 1) {
      piVar1 = QList<int>::at(colPerPage,i_00);
      i_01 = (long)(int)lVar4;
      lVar4 = *piVar1 + i_01;
      local_38 = 0.0;
      for (; i_01 < lVar4; i_01 = i_01 + 1) {
        pdVar2 = QList<double>::at(&this->m_widths,i_01);
        local_38 = local_38 + *pdVar2;
      }
      pdVar3 = QList<double>::operator[](__return_storage_ptr__,i_00);
      *pdVar3 = local_38;
    }
    return __return_storage_ptr__;
  }
  qt_assert("colPerPage.size() <= m_pages",
            "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsTableBreakingLogic.cpp"
            ,0x55);
}

Assistant:

TableBreakingLogic::WidthVector TableBreakingLogic::widthPerPage(const QVector<int> &colPerPage) const
{
    Q_ASSERT(colPerPage.size() <= m_pages);
    int startColumn = 0;
    WidthVector widths;
    widths.resize(colPerPage.size());
    for (int page = 0; page < colPerPage.size(); ++page) {
        const int numColumnsForPage = colPerPage[page];
        qreal pageTotalWidth = 0;
        for (int i = startColumn; i < startColumn + numColumnsForPage; ++i) {
            pageTotalWidth += m_widths[i];
        }
        startColumn += numColumnsForPage;
        widths[page] = pageTotalWidth;
    }
    return widths;
}